

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_xz.c
# Opt level: O2

int archive_compressor_xz_open(archive_write_filter *f)

{
  lzma_stream *strm;
  uint32_t *puVar1;
  undefined1 auVar2 [16];
  byte bVar3;
  lzma_match_finder lVar4;
  lzma_bool lVar5;
  byte bVar6;
  int iVar7;
  uint uVar8;
  lzma_ret lVar9;
  uint uVar10;
  undefined1 *puVar11;
  long lVar12;
  byte bVar13;
  uint uVar14;
  char *fmt;
  archive *a;
  size_t __size;
  
  puVar1 = (uint32_t *)f->data;
  iVar7 = __archive_write_open_filter(f->next_filter);
  if (iVar7 != 0) {
    return iVar7;
  }
  puVar11 = *(undefined1 **)(puVar1 + 0x4a);
  if (puVar11 == (undefined1 *)0x0) {
    __size = 0x10000;
    if (f->archive->magic == 0xb0c5c0de) {
      uVar8 = archive_write_get_bytes_per_block(f->archive);
      __size = (long)(int)uVar8;
      if ((uVar8 < 0x10001) && (__size = 0x10000, uVar8 != 0)) {
        auVar2._8_8_ = 0;
        auVar2._0_8_ = (long)(int)uVar8;
        __size = 0x10000 - SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x10000)) % auVar2,0);
      }
    }
    *(size_t *)(puVar1 + 0x4c) = __size;
    puVar11 = (undefined1 *)malloc(__size);
    *(undefined1 **)(puVar1 + 0x4a) = puVar11;
    if (puVar11 != (undefined1 *)0x0) goto LAB_004b66b7;
    a = f->archive;
    fmt = "Can\'t allocate data for compression buffer";
  }
  else {
LAB_004b66b7:
    f->write = archive_compressor_xz_write;
    if (f->code == 9) {
      lVar12 = (long)(int)*puVar1;
      puVar1[0x2c] = option_values[lVar12].dict_size;
      puVar1[0x2e] = 0;
      puVar1[0x2f] = 0;
      puVar1[0x30] = 0;
      puVar1[0x31] = 3;
      puVar1[0x32] = 0;
      puVar1[0x33] = 2;
      puVar1[0x34] = (2 < lVar12) + 1;
      lVar4 = option_values[lVar12].mf;
      puVar1[0x35] = option_values[lVar12].nice_len;
      puVar1[0x36] = lVar4;
      puVar1[0x37] = 0;
      puVar1[0x24] = 1;
      puVar1[0x25] = 0x40000000;
      *(uint32_t **)(puVar1 + 0x26) = puVar1 + 0x2c;
      puVar1[0x28] = 0xffffffff;
      puVar1[0x29] = 0xffffffff;
    }
    else {
      lVar5 = lzma_lzma_preset((lzma_options_lzma *)(puVar1 + 0x2c),*puVar1);
      if (lVar5 != '\0') {
        archive_set_error(f->archive,-1,"Internal error initializing compression library");
      }
      puVar1[0x24] = 0x21;
      puVar1[0x25] = 0;
      *(lzma_options_lzma **)(puVar1 + 0x26) = (lzma_options_lzma *)(puVar1 + 0x2c);
      puVar1[0x28] = 0xffffffff;
      puVar1[0x29] = 0xffffffff;
      puVar11 = *(undefined1 **)(puVar1 + 0x4a);
    }
    strm = (lzma_stream *)(puVar1 + 2);
    memset(strm,0,0x88);
    *(undefined1 **)(puVar1 + 8) = puVar11;
    *(undefined8 *)(puVar1 + 10) = *(undefined8 *)(puVar1 + 0x4c);
    if (f->code == 5) {
      lVar9 = lzma_alone_encoder(strm,(lzma_options_lzma *)(puVar1 + 0x2c));
    }
    else if (f->code == 6) {
      lVar9 = lzma_stream_encoder(strm,(lzma_filter *)(puVar1 + 0x24),LZMA_CHECK_CRC64);
    }
    else {
      uVar8 = puVar1[0x2c];
      if (0x7fff000 < uVar8 - 0x1000) {
        archive_set_error(f->archive,-1,"Unacceptable dictionary size for lzip: %d",(ulong)uVar8);
        return -0x1e;
      }
      for (uVar10 = 0x1b;
          (uVar14 = 0xb, 0xb < uVar10 && (uVar14 = uVar10, (uVar8 >> (uVar10 & 0x1f) & 1) == 0));
          uVar10 = uVar10 - 1) {
      }
      bVar3 = (byte)uVar14;
      bVar6 = 0;
      bVar13 = bVar3;
      if (1 << (bVar3 & 0x1f) < (int)uVar8) {
        bVar13 = bVar3 + 1;
        bVar6 = (byte)(((int)((1 << (bVar13 & 0x1f)) - uVar8) / (1 << (bVar3 - 3 & 0x1f)) & 7U) << 5
                      );
      }
      puVar1[0x50] = 0;
      *puVar11 = 0x4c;
      *(undefined1 *)(*(long *)(puVar1 + 0x4a) + 1) = 0x5a;
      *(undefined1 *)(*(long *)(puVar1 + 0x4a) + 2) = 0x49;
      *(undefined1 *)(*(long *)(puVar1 + 0x4a) + 3) = 0x50;
      *(undefined1 *)(*(long *)(puVar1 + 0x4a) + 4) = 1;
      *(byte *)(*(long *)(puVar1 + 0x4a) + 5) = bVar13 & 0x1f | bVar6;
      *(long *)(puVar1 + 8) = *(long *)(puVar1 + 8) + 6;
      *(long *)(puVar1 + 10) = *(long *)(puVar1 + 10) + -6;
      lVar9 = lzma_raw_encoder(strm,(lzma_filter *)(puVar1 + 0x24));
    }
    if (lVar9 == LZMA_OK) {
      f->data = puVar1;
      return 0;
    }
    if (lVar9 != LZMA_MEM_ERROR) {
      a = f->archive;
      fmt = "Internal error initializing compression library: It\'s a bug in liblzma";
      iVar7 = -1;
      goto LAB_004b6925;
    }
    a = f->archive;
    fmt = "Internal error initializing compression library: Cannot allocate memory";
  }
  iVar7 = 0xc;
LAB_004b6925:
  archive_set_error(a,iVar7,fmt);
  return -0x1e;
}

Assistant:

static int
archive_compressor_xz_open(struct archive_write_filter *f)
{
	struct private_data *data = f->data;
	int ret;

	ret = __archive_write_open_filter(f->next_filter);
	if (ret != ARCHIVE_OK)
		return (ret);

	if (data->compressed == NULL) {
		size_t bs = 65536, bpb;
		if (f->archive->magic == ARCHIVE_WRITE_MAGIC) {
			/* Buffer size should be a multiple number of the of bytes
			 * per block for performance. */
			bpb = archive_write_get_bytes_per_block(f->archive);
			if (bpb > bs)
				bs = bpb;
			else if (bpb != 0)
				bs -= bs % bpb;
		}
		data->compressed_buffer_size = bs;
		data->compressed
		    = (unsigned char *)malloc(data->compressed_buffer_size);
		if (data->compressed == NULL) {
			archive_set_error(f->archive, ENOMEM,
			    "Can't allocate data for compression buffer");
			return (ARCHIVE_FATAL);
		}
	}

	f->write = archive_compressor_xz_write;

	/* Initialize compression library. */
	if (f->code == ARCHIVE_FILTER_LZIP) {
		const struct option_value *val =
		    &option_values[data->compression_level];

		data->lzma_opt.dict_size = val->dict_size;
		data->lzma_opt.preset_dict = NULL;
		data->lzma_opt.preset_dict_size = 0;
		data->lzma_opt.lc = LZMA_LC_DEFAULT;
		data->lzma_opt.lp = LZMA_LP_DEFAULT;
		data->lzma_opt.pb = LZMA_PB_DEFAULT;
		data->lzma_opt.mode =
		    data->compression_level<= 2? LZMA_MODE_FAST:LZMA_MODE_NORMAL;
		data->lzma_opt.nice_len = val->nice_len;
		data->lzma_opt.mf = val->mf;
		data->lzma_opt.depth = 0;
		data->lzmafilters[0].id = LZMA_FILTER_LZMA1;
		data->lzmafilters[0].options = &data->lzma_opt;
		data->lzmafilters[1].id = LZMA_VLI_UNKNOWN;/* Terminate */
	} else {
		if (lzma_lzma_preset(&data->lzma_opt, data->compression_level)) {
			archive_set_error(f->archive, ARCHIVE_ERRNO_MISC,
			    "Internal error initializing compression library");
		}
		data->lzmafilters[0].id = LZMA_FILTER_LZMA2;
		data->lzmafilters[0].options = &data->lzma_opt;
		data->lzmafilters[1].id = LZMA_VLI_UNKNOWN;/* Terminate */
	}
	ret = archive_compressor_xz_init_stream(f, data);
	if (ret == LZMA_OK) {
		f->data = data;
		return (0);
	}
	return (ARCHIVE_FATAL);
}